

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>::
find<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Entry_const,capnp::StructSchema&>
          (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks> *this,
          ArrayPtr<const_kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> table,
          StructSchema *params)

{
  int iVar1;
  long lVar2;
  RawBrandedSchema *pRVar3;
  HandlerBase *pHVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  uint hash;
  Entry *this_00;
  StructSchema *in_R8;
  ulong uVar9;
  Maybe<unsigned_long> MVar10;
  
  this_00 = table.ptr;
  lVar2._0_2_ = this_00[1].key.baseType;
  lVar2._2_1_ = this_00[1].key.listDepth;
  lVar2._3_1_ = this_00[1].key.isImplicitParam;
  lVar2._4_2_ = this_00[1].key.field_3;
  lVar2._6_2_ = *(undefined2 *)&this_00[1].key.field_0x6;
  aVar8.value = table.size_;
  if (lVar2 != 0) {
    pRVar3 = (in_R8->super_Schema).raw;
    hash = (uint)((int)((ulong)pRVar3 >> 0x20) * 0xbfe3 + (int)pRVar3 != 0);
    uVar7 = kj::_::chooseBucket(hash,(uint)lVar2);
    aVar8 = extraout_RDX;
    while( true ) {
      uVar9 = (ulong)uVar7;
      pHVar4 = this_00->value;
      iVar1 = *(int *)((long)&pHVar4[uVar9]._vptr_HandlerBase + 4);
      if (iVar1 == 0) break;
      if (((iVar1 != 1) && (*(uint *)&pHVar4[uVar9]._vptr_HandlerBase == hash)) &&
         (bVar6 = HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks::
                  matches<capnp::StructSchema&>
                            ((Callbacks *)this_00,(Entry *)((ulong)(iVar1 - 2) * 0x18 + table.size_)
                             ,in_R8), aVar8 = extraout_RDX_00, bVar6)) {
        iVar1 = *(int *)((long)&pHVar4[uVar9]._vptr_HandlerBase + 4);
        *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(iVar1 - 2);
        goto LAB_003dc172;
      }
      uVar7 = 0;
      lVar5._0_2_ = this_00[1].key.baseType;
      lVar5._2_1_ = this_00[1].key.listDepth;
      lVar5._3_1_ = this_00[1].key.isImplicitParam;
      lVar5._4_2_ = this_00[1].key.field_3;
      lVar5._6_2_ = *(undefined2 *)&this_00[1].key.field_0x6;
      if (uVar9 + 1 != lVar5) {
        uVar7 = (uint)(uVar9 + 1);
      }
    }
  }
  *this = (HashIndex<kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::Callbacks>)0x0;
LAB_003dc172:
  MVar10.ptr.field_1.value = aVar8.value;
  MVar10.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar10.ptr;
}

Assistant:

Maybe<size_t> find(kj::ArrayPtr<Row> table, Params&&... params) const {
    if (buckets.size() == 0) return nullptr;

    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // not found.
        return nullptr;
      } else if (bucket.isErased()) {
        // skip, keep searching
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // found
        return size_t(bucket.getPos());
      }
    }
  }